

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderControlStatementTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::ConditionalWorkloadReferenceCase::writeWorkload
          (ConditionalWorkloadReferenceCase *this,ostringstream *dst,char *resultVariableName,
          char *inputVariableName)

{
  PerfCaseType PVar1;
  bool isVertexCase;
  char *inputVariableName_local;
  char *resultVariableName_local;
  ostringstream *dst_local;
  ConditionalWorkloadReferenceCase *this_local;
  
  PVar1 = (this->super_WorkloadReferenceCase).super_ControlStatementCase.super_ShaderPerformanceCase
          .m_caseType;
  std::operator<<(&dst->super_basic_ostream<char,_std::char_traits<char>_>,"\t");
  writeConditionalWorkload(dst,resultVariableName,inputVariableName);
  std::operator<<(&dst->super_basic_ostream<char,_std::char_traits<char>_>,"\n");
  if ((PVar1 != CASETYPE_VERTEX) && ((this->m_isAttributeStable & 1U) == 0)) {
    std::operator<<(&dst->super_basic_ostream<char,_std::char_traits<char>_>,
                    "\tres.x = fract(res.x);\n");
  }
  return;
}

Assistant:

void ConditionalWorkloadReferenceCase::writeWorkload (std::ostringstream& dst, const char* resultVariableName, const char* inputVariableName) const
{
	bool isVertexCase = m_caseType == CASETYPE_VERTEX;

	dst << "\t";
	writeConditionalWorkload(dst, resultVariableName, inputVariableName);
	dst << "\n";

	if (!isVertexCase && !m_isAttributeStable)
	{
		// Corresponds to the fract() done in a real test's fragment case with non-stable attribute.
		dst << "	res.x = fract(res.x);\n";
	}
}